

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Serializer.cpp
# Opt level: O0

void __thiscall adios2::format::BP5Serializer::RecalcAttributeStorageSize(BP5Serializer *this)

{
  void *pvVar1;
  uint uVar2;
  long lVar3;
  long in_RDI;
  size_t NewAttributeSize;
  FMFieldList LastAttributeField;
  
  if (*(int *)(in_RDI + 0xb0) != 0) {
    lVar3 = *(long *)(in_RDI + 0xb8) + (long)(*(int *)(in_RDI + 0xb0) + -1) * 0x18;
    uVar2 = *(int *)(lVar3 + 0x14) + *(int *)(lVar3 + 0x10) + 7U & 0xfffffff8;
    pvVar1 = realloc(*(void **)(in_RDI + 200),(long)(int)uVar2 + 8);
    *(void **)(in_RDI + 200) = pvVar1;
    memset((void *)(*(long *)(in_RDI + 200) + (long)*(int *)(in_RDI + 0xd0)),0,
           (long)(int)uVar2 - (long)*(int *)(in_RDI + 0xd0));
    *(uint *)(in_RDI + 0xd0) = uVar2;
  }
  return;
}

Assistant:

void BP5Serializer::RecalcAttributeStorageSize()
{
    if (Info.AttributeFieldCount)
    {
        FMFieldList LastAttributeField;
        size_t NewAttributeSize;
        LastAttributeField = &Info.AttributeFields[Info.AttributeFieldCount - 1];
        NewAttributeSize =
            (LastAttributeField->field_offset + LastAttributeField->field_size + 7) & ~7;
        Info.AttributeData = realloc(Info.AttributeData, NewAttributeSize + 8);
        memset((char *)(Info.AttributeData) + Info.AttributeSize, 0,
               NewAttributeSize - Info.AttributeSize);
        Info.AttributeSize = (int)NewAttributeSize;
    }
}